

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O0

_Bool get_commasep_word(ptrlen *list,ptrlen *word)

{
  void *pvVar1;
  size_t sVar2;
  bool bVar3;
  size_t wordlen;
  char *comma;
  ptrlen *word_local;
  ptrlen *list_local;
  
  while( true ) {
    bVar3 = false;
    if (list->len != 0) {
      bVar3 = *list->ptr == ',';
    }
    if (!bVar3) break;
    list->ptr = (void *)((long)list->ptr + 1);
    list->len = list->len - 1;
  }
  if (list->len == 0) {
    list_local._7_1_ = false;
  }
  else {
    pvVar1 = memchr(list->ptr,0x2c,list->len);
    if (pvVar1 == (void *)0x0) {
      word->ptr = list->ptr;
      word->len = list->len;
      list->len = 0;
    }
    else {
      sVar2 = (long)pvVar1 - (long)list->ptr;
      word->ptr = list->ptr;
      word->len = sVar2;
      list->ptr = (void *)((long)list->ptr + sVar2 + 1);
      list->len = list->len - (sVar2 + 1);
    }
    list_local._7_1_ = true;
  }
  return list_local._7_1_;
}

Assistant:

bool get_commasep_word(ptrlen *list, ptrlen *word)
{
    const char *comma;

    /*
     * Discard empty list elements, should there be any, because we
     * never want to return one as if it was a real string. (This
     * introduces a mild tolerance of badly formatted data in lists we
     * receive, but I think that's acceptable.)
     */
    while (list->len > 0 && *(const char *)list->ptr == ',') {
        list->ptr = (const char *)list->ptr + 1;
        list->len--;
    }

    if (!list->len)
        return false;

    comma = memchr(list->ptr, ',', list->len);
    if (!comma) {
        *word = *list;
        list->len = 0;
    } else {
        size_t wordlen = comma - (const char *)list->ptr;
        word->ptr = list->ptr;
        word->len = wordlen;
        list->ptr = (const char *)list->ptr + wordlen + 1;
        list->len -= wordlen + 1;
    }
    return true;
}